

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode * PVIP_node_append_string_node(PVIPParserContext *parser,PVIPNode *node,PVIPNode *stuff)

{
  PVIPNode *stuff_local;
  PVIPNode *node_local;
  PVIPParserContext *parser_local;
  
  if (node->type == PVIP_NODE_STRING) {
    parser_local = (PVIPParserContext *)
                   PVIP_node_new_children2(parser,PVIP_NODE_STRING_CONCAT,node,stuff);
  }
  else {
    if (node->type != PVIP_NODE_STRING_CONCAT) {
      abort();
    }
    parser_local = (PVIPParserContext *)
                   PVIP_node_new_children2(parser,PVIP_NODE_STRING_CONCAT,node,stuff);
  }
  return (PVIPNode *)parser_local;
}

Assistant:

PVIPNode* PVIP_node_append_string_node(PVIPParserContext *parser, PVIPNode*node, PVIPNode*stuff) {
    if (node->type == PVIP_NODE_STRING) {
        return PVIP_node_new_children2(parser, PVIP_NODE_STRING_CONCAT, node, stuff);
    } else if (node->type == PVIP_NODE_STRING_CONCAT) {
        return PVIP_node_new_children2(parser, PVIP_NODE_STRING_CONCAT, node, stuff);
    } else {
        abort();
    }
}